

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qsslsocket.cpp
# Opt level: O2

void QSslSocket::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  bool bVar1;
  undefined8 *puVar2;
  InterfaceType *pIVar3;
  
  if (_c != RegisterMethodArgumentMetaType) {
    if (_c != IndexOfMethod) {
      if (_c != InvokeMetaMethod) {
        return;
      }
      switch(_id) {
      case 0:
        encrypted((QSslSocket *)_o);
        return;
      case 1:
        peerVerifyError((QSslSocket *)_o,(QSslError *)_a[1]);
        return;
      case 2:
        sslErrors((QSslSocket *)_o,(QList<QSslError> *)_a[1]);
        return;
      case 3:
        modeChanged((QSslSocket *)_o,*_a[1]);
        return;
      case 4:
        encryptedBytesWritten((QSslSocket *)_o,*_a[1]);
        return;
      case 5:
        preSharedKeyAuthenticationRequired((QSslSocket *)_o,*_a[1]);
        return;
      case 6:
        newSessionTicketReceived((QSslSocket *)_o);
        return;
      case 7:
        alertSent((QSslSocket *)_o,*_a[1],*_a[2],(QString *)_a[3]);
        return;
      case 8:
        alertReceived((QSslSocket *)_o,*_a[1],*_a[2],(QString *)_a[3]);
        return;
      case 9:
        handshakeInterruptedOnError((QSslSocket *)_o,(QSslError *)_a[1]);
        return;
      case 10:
        startClientEncryption((QSslSocket *)_o);
        return;
      case 0xb:
        startServerEncryption((QSslSocket *)_o);
        return;
      case 0xc:
        *(undefined1 *)(*(long *)(_o + 8) + 0x276) = 1;
        return;
      case 0xd:
        QSslSocketPrivate::_q_connectedSlot(*(QSslSocketPrivate **)(_o + 8));
        return;
      case 0xe:
        QSslSocketPrivate::_q_hostFoundSlot(*(QSslSocketPrivate **)(_o + 8));
        return;
      case 0xf:
        QSslSocketPrivate::_q_disconnectedSlot(*(QSslSocketPrivate **)(_o + 8));
        return;
      case 0x10:
        QSslSocketPrivate::_q_stateChangedSlot(*(QSslSocketPrivate **)(_o + 8),*_a[1]);
        return;
      case 0x11:
        QSslSocketPrivate::_q_errorSlot(*(QSslSocketPrivate **)(_o + 8),ConnectionRefusedError);
        return;
      case 0x12:
        QSslSocketPrivate::_q_readyReadSlot(*(QSslSocketPrivate **)(_o + 8));
        return;
      case 0x13:
        QSslSocketPrivate::_q_channelReadyReadSlot(*(QSslSocketPrivate **)(_o + 8),*_a[1]);
        return;
      case 0x14:
        QSslSocketPrivate::_q_bytesWrittenSlot(*(QSslSocketPrivate **)(_o + 8),*_a[1]);
        return;
      case 0x15:
        QSslSocketPrivate::_q_channelBytesWrittenSlot(*(QSslSocketPrivate **)(_o + 8),*_a[1],*_a[2])
        ;
        return;
      case 0x16:
        QSslSocketPrivate::_q_readChannelFinishedSlot(*(QSslSocketPrivate **)(_o + 8));
        return;
      case 0x17:
        QSslSocketPrivate::_q_flushWriteBuffer(*(QSslSocketPrivate **)(_o + 8));
        return;
      case 0x18:
        QSslSocketPrivate::_q_flushReadBuffer(*(QSslSocketPrivate **)(_o + 8));
        return;
      case 0x19:
        QSslSocketPrivate::_q_resumeImplementation(*(QSslSocketPrivate **)(_o + 8));
        return;
      default:
        return;
      }
    }
    bVar1 = QtMocHelpers::indexOfMethod<void(QSslSocket::*)()>
                      ((QtMocHelpers *)_a,(void **)encrypted,0,0);
    if (bVar1) {
      return;
    }
    bVar1 = QtMocHelpers::indexOfMethod<void(QSslSocket::*)(QSslError_const&)>
                      ((QtMocHelpers *)_a,(void **)peerVerifyError,0,1);
    if (bVar1) {
      return;
    }
    bVar1 = QtMocHelpers::indexOfMethod<void(QSslSocket::*)(QList<QSslError>const&)>
                      ((QtMocHelpers *)_a,(void **)sslErrors,0,2);
    if (bVar1) {
      return;
    }
    bVar1 = QtMocHelpers::indexOfMethod<void(QSslSocket::*)(QSslSocket::SslMode)>
                      ((QtMocHelpers *)_a,(void **)modeChanged,0,3);
    if (bVar1) {
      return;
    }
    bVar1 = QtMocHelpers::indexOfMethod<void(QSslSocket::*)(long_long)>
                      ((QtMocHelpers *)_a,(void **)encryptedBytesWritten,0,4);
    if (bVar1) {
      return;
    }
    bVar1 = QtMocHelpers::indexOfMethod<void(QSslSocket::*)(QSslPreSharedKeyAuthenticator*)>
                      ((QtMocHelpers *)_a,(void **)preSharedKeyAuthenticationRequired,0,5);
    if (bVar1) {
      return;
    }
    bVar1 = QtMocHelpers::indexOfMethod<void(QSslSocket::*)()>
                      ((QtMocHelpers *)_a,(void **)newSessionTicketReceived,0,6);
    if (bVar1) {
      return;
    }
    bVar1 = QtMocHelpers::
            indexOfMethod<void(QSslSocket::*)(QSsl::AlertLevel,QSsl::AlertType,QString_const&)>
                      ((QtMocHelpers *)_a,(void **)alertSent,0,7);
    if (bVar1) {
      return;
    }
    bVar1 = QtMocHelpers::
            indexOfMethod<void(QSslSocket::*)(QSsl::AlertLevel,QSsl::AlertType,QString_const&)>
                      ((QtMocHelpers *)_a,(void **)alertReceived,0,8);
    if (bVar1) {
      return;
    }
    QtMocHelpers::indexOfMethod<void(QSslSocket::*)(QSslError_const&)>
              ((QtMocHelpers *)_a,(void **)handshakeInterruptedOnError,0,9);
    return;
  }
  if (_id == 2) {
    puVar2 = (undefined8 *)*_a;
    if (*_a[1] == 0) {
      pIVar3 = &QtPrivate::QMetaTypeInterfaceWrapper<QList<QSslError>_>::metaType;
LAB_00234912:
      *puVar2 = pIVar3;
      return;
    }
  }
  else if (_id == 0x10) {
    puVar2 = (undefined8 *)*_a;
    if (*_a[1] == 0) {
      pIVar3 = &QtPrivate::QMetaTypeInterfaceWrapper<QAbstractSocket::SocketState>::metaType;
      goto LAB_00234912;
    }
  }
  else if (_id == 0x11) {
    puVar2 = (undefined8 *)*_a;
    if (*_a[1] == 0) {
      pIVar3 = &QtPrivate::QMetaTypeInterfaceWrapper<QAbstractSocket::SocketError>::metaType;
      goto LAB_00234912;
    }
  }
  else {
    puVar2 = (undefined8 *)*_a;
  }
  *puVar2 = 0;
  return;
}

Assistant:

void QSslSocket::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QSslSocket *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->encrypted(); break;
        case 1: _t->peerVerifyError((*reinterpret_cast< std::add_pointer_t<QSslError>>(_a[1]))); break;
        case 2: _t->sslErrors((*reinterpret_cast< std::add_pointer_t<QList<QSslError>>>(_a[1]))); break;
        case 3: _t->modeChanged((*reinterpret_cast< std::add_pointer_t<QSslSocket::SslMode>>(_a[1]))); break;
        case 4: _t->encryptedBytesWritten((*reinterpret_cast< std::add_pointer_t<qint64>>(_a[1]))); break;
        case 5: _t->preSharedKeyAuthenticationRequired((*reinterpret_cast< std::add_pointer_t<QSslPreSharedKeyAuthenticator*>>(_a[1]))); break;
        case 6: _t->newSessionTicketReceived(); break;
        case 7: _t->alertSent((*reinterpret_cast< std::add_pointer_t<QSsl::AlertLevel>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QSsl::AlertType>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[3]))); break;
        case 8: _t->alertReceived((*reinterpret_cast< std::add_pointer_t<QSsl::AlertLevel>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QSsl::AlertType>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[3]))); break;
        case 9: _t->handshakeInterruptedOnError((*reinterpret_cast< std::add_pointer_t<QSslError>>(_a[1]))); break;
        case 10: _t->startClientEncryption(); break;
        case 11: _t->startServerEncryption(); break;
        case 12: _t->ignoreSslErrors(); break;
        case 13: _t->d_func()->_q_connectedSlot(); break;
        case 14: _t->d_func()->_q_hostFoundSlot(); break;
        case 15: _t->d_func()->_q_disconnectedSlot(); break;
        case 16: _t->d_func()->_q_stateChangedSlot((*reinterpret_cast< std::add_pointer_t<QAbstractSocket::SocketState>>(_a[1]))); break;
        case 17: _t->d_func()->_q_errorSlot((*reinterpret_cast< std::add_pointer_t<QAbstractSocket::SocketError>>(_a[1]))); break;
        case 18: _t->d_func()->_q_readyReadSlot(); break;
        case 19: _t->d_func()->_q_channelReadyReadSlot((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 20: _t->d_func()->_q_bytesWrittenSlot((*reinterpret_cast< std::add_pointer_t<qint64>>(_a[1]))); break;
        case 21: _t->d_func()->_q_channelBytesWrittenSlot((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<qint64>>(_a[2]))); break;
        case 22: _t->d_func()->_q_readChannelFinishedSlot(); break;
        case 23: _t->d_func()->_q_flushWriteBuffer(); break;
        case 24: _t->d_func()->_q_flushReadBuffer(); break;
        case 25: _t->d_func()->_q_resumeImplementation(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 2:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QList<QSslError> >(); break;
            }
            break;
        case 16:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QAbstractSocket::SocketState >(); break;
            }
            break;
        case 17:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QAbstractSocket::SocketError >(); break;
            }
            break;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QSslSocket::*)()>(_a, &QSslSocket::encrypted, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QSslSocket::*)(const QSslError & )>(_a, &QSslSocket::peerVerifyError, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QSslSocket::*)(const QList<QSslError> & )>(_a, &QSslSocket::sslErrors, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QSslSocket::*)(QSslSocket::SslMode )>(_a, &QSslSocket::modeChanged, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QSslSocket::*)(qint64 )>(_a, &QSslSocket::encryptedBytesWritten, 4))
            return;
        if (QtMocHelpers::indexOfMethod<void (QSslSocket::*)(QSslPreSharedKeyAuthenticator * )>(_a, &QSslSocket::preSharedKeyAuthenticationRequired, 5))
            return;
        if (QtMocHelpers::indexOfMethod<void (QSslSocket::*)()>(_a, &QSslSocket::newSessionTicketReceived, 6))
            return;
        if (QtMocHelpers::indexOfMethod<void (QSslSocket::*)(QSsl::AlertLevel , QSsl::AlertType , const QString & )>(_a, &QSslSocket::alertSent, 7))
            return;
        if (QtMocHelpers::indexOfMethod<void (QSslSocket::*)(QSsl::AlertLevel , QSsl::AlertType , const QString & )>(_a, &QSslSocket::alertReceived, 8))
            return;
        if (QtMocHelpers::indexOfMethod<void (QSslSocket::*)(const QSslError & )>(_a, &QSslSocket::handshakeInterruptedOnError, 9))
            return;
    }
}